

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

void __thiscall
CLI::Validator::Validator
          (Validator *this,string *validator_desc,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *func)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pcVar1 = (validator_desc->_M_dataplus)._M_p;
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + validator_desc->_M_string_length);
  ::std::function<std::__cxx11::string()>::
  function<CLI::Validator::Validator(std::__cxx11::string,std::function<std::__cxx11::string(std::__cxx11::string&)>)::_lambda()_1_,void>
            ((function<std::__cxx11::string()> *)this,(anon_class_32_1_5ff8519c *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  *(undefined8 *)&(this->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->func_).super__Function_base._M_functor + 8) = 0;
  (this->func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->func_)._M_invoker = func->_M_invoker;
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->func_).super__Function_base._M_functor =
         *(undefined8 *)&(func->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->func_).super__Function_base._M_functor + 8) = uVar2;
    (this->func_).super__Function_base._M_manager = (func->super__Function_base)._M_manager;
    (func->super__Function_base)._M_manager = (_Manager_type)0x0;
    func->_M_invoker = (_Invoker_type)0x0;
  }
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  this->application_index_ = -1;
  this->active_ = true;
  this->non_modifying_ = false;
  return;
}

Assistant:

Validator(std::string validator_desc, std::function<std::string(std::string &)> func)
        : desc_function_([validator_desc]() { return validator_desc; }), func_(std::move(func)) {}